

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsBuilder.cpp
# Opt level: O2

void __thiscall
Refal2::COperationsBuilder::AddMatchLeft_V
          (COperationsBuilder *this,CQualifier *qualifier,bool saveInTable)

{
  bool bVar1;
  undefined4 uStack_20;
  
  bVar1 = CQualifier::IsEmpty(qualifier);
  if (bVar1) {
    if (saveInTable) {
      addOperation_VE(this,OT_MatchLeftBeginSaveToTable_V);
      uStack_20 = OT_MatchLeftSaveToTable_E;
    }
    else {
      addOperation_VE(this,OT_MatchLeftBegin_V);
      uStack_20 = OT_MatchLeft_E;
    }
    addOperation(this,uStack_20);
    return;
  }
  if (saveInTable) {
    addOperation_VE(this,OT_MatchLeftWithQulifierBeginSaveToTable_V,qualifier);
    uStack_20 = OT_MatchLeftWithQulifierSaveToTable_E;
  }
  else {
    addOperation_VE(this,OT_MatchLeftWithQulifierBegin_V,qualifier);
    uStack_20 = OT_MatchLeftWithQulifier_E;
  }
  addQualifierIndexOperation(this,uStack_20,qualifier);
  return;
}

Assistant:

void COperationsBuilder::AddMatchLeft_V( CQualifier& qualifier,
	bool saveInTable )
{
	DEBUG_PRINT( __FUNCTION__ )
	if( qualifier.IsEmpty() ) {
		if( saveInTable ) {
			addOperation_VE( OT_MatchLeftBeginSaveToTable_V );
			addNoArgumensOperation( OT_MatchLeftSaveToTable_E );
		} else {
			addOperation_VE( OT_MatchLeftBegin_V );
			addNoArgumensOperation( OT_MatchLeft_E );
		}
	} else {
		if( saveInTable ) {
			addOperation_VE( OT_MatchLeftWithQulifierBeginSaveToTable_V,
				qualifier );
			addQualifierIndexOperation( OT_MatchLeftWithQulifierSaveToTable_E,
				qualifier );
		} else {
			addOperation_VE( OT_MatchLeftWithQulifierBegin_V, qualifier );
			addQualifierIndexOperation( OT_MatchLeftWithQulifier_E, qualifier );
		}
	}
}